

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

uint64_t sum_quotients<unsigned_long,unsigned_long>
                   (random_numerators<unsigned_long> *vals,unsigned_long *div)

{
  ulong *puVar1;
  uint64_t uVar2;
  long lVar3;
  
  if ((ulong)vals->_length == 0) {
    uVar2 = 0;
  }
  else {
    lVar3 = 0;
    uVar2 = 0;
    do {
      puVar1 = (ulong *)((long)vals->_pData + lVar3);
      lVar3 = lVar3 + 8;
      uVar2 = uVar2 + *puVar1 / *div;
    } while ((ulong)vals->_length << 3 != lVar3);
  }
  return uVar2;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}